

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emu2149.c
# Opt level: O0

UINT8 device_start_ay8910_emu(AY8910_CFG *cfg,DEV_INFO *retDevInf)

{
  uint c;
  EPSG *psg;
  int type;
  bool bVar1;
  bool bVar2;
  uint local_34;
  UINT32 rate;
  UINT32 clock;
  UINT8 flags;
  UINT8 isYM;
  EPSG *chip;
  DEV_INFO *retDevInf_local;
  AY8910_CFG *cfg_local;
  
  c = (cfg->_genCfg).clock;
  bVar2 = -1 < (int)(cfg->chipType & 0xf0);
  bVar1 = (cfg->chipType & 0xf0) != 0;
  rate._2_1_ = cfg->chipFlags;
  if (!bVar1 || !bVar2) {
    rate._2_1_ = rate._2_1_ & 0xef;
  }
  if ((rate._2_1_ & 0x10) == 0) {
    local_34 = c >> 3;
  }
  else {
    local_34 = c >> 4;
  }
  if (((cfg->_genCfg).srMode == '\x01') ||
     (((cfg->_genCfg).srMode == '\x02' && (local_34 < (cfg->_genCfg).smplRate)))) {
    local_34 = (cfg->_genCfg).smplRate;
  }
  psg = EPSG_new(c,local_34);
  if (psg == (EPSG *)0x0) {
    cfg_local._7_1_ = 0xff;
  }
  else {
    EPSG_set_quality(psg,0);
    type = 2;
    if (bVar1 && bVar2) {
      type = 1;
    }
    EPSG_setVolumeMode(psg,type);
    EPSG_setFlags(psg,rate._2_1_);
    psg->_devData = (DEV_DATA)psg;
    INIT_DEVINF(retDevInf,&psg->_devData,local_34,&devDef_YM2149_Emu);
    cfg_local._7_1_ = '\0';
  }
  return cfg_local._7_1_;
}

Assistant:

static UINT8 device_start_ay8910_emu(const AY8910_CFG* cfg, DEV_INFO* retDevInf)
{
	EPSG* chip;
	UINT8 isYM;
	UINT8 flags;
	UINT32 clock;
	UINT32 rate;
	
	clock = cfg->_genCfg.clock;
	isYM = ((cfg->chipType & 0xF0) > 0x00);
	flags = cfg->chipFlags;
	if (! isYM)
		flags &= ~YM2149_PIN26_LOW;
	
	if (flags & YM2149_PIN26_LOW)
		rate = clock / 2 / 8;
	else
		rate = clock / 8;
	SRATE_CUSTOM_HIGHEST(cfg->_genCfg.srMode, rate, cfg->_genCfg.smplRate);
	
	chip = EPSG_new(clock, rate);
	if (chip == NULL)
		return 0xFF;
	EPSG_set_quality(chip, 0);	// disable internal sample rate converter
	EPSG_setVolumeMode(chip, isYM ? 1 : 2);
	EPSG_setFlags(chip, flags);
	
	chip->_devData.chipInf = chip;
	INIT_DEVINF(retDevInf, &chip->_devData, rate, &devDef_YM2149_Emu);
	return 0x00;
}